

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOBase.c
# Opt level: O0

void FAPOBase_ProcessThru
               (FAPOBase *fapo,void *pInputBuffer,float *pOutputBuffer,uint32_t FrameCount,
               uint16_t InputChannelCount,uint16_t OutputChannelCount,uint8_t MixWithOutput)

{
  uint uVar1;
  float *input;
  uint32_t ci;
  uint32_t co;
  uint32_t i;
  uint16_t OutputChannelCount_local;
  uint16_t InputChannelCount_local;
  uint32_t FrameCount_local;
  float *pOutputBuffer_local;
  void *pInputBuffer_local;
  FAPOBase *fapo_local;
  
  if (MixWithOutput == '\0') {
    for (i = 0; i < FrameCount; i = i + 1) {
      for (co = 0; co < OutputChannelCount; co = co + 1) {
        for (ci = 0; ci < InputChannelCount; ci = ci + 1) {
          pOutputBuffer[i * OutputChannelCount + co] =
               *(float *)((long)pInputBuffer + (ulong)(i * InputChannelCount + ci) * 4);
        }
      }
    }
  }
  else {
    for (i = 0; i < FrameCount; i = i + 1) {
      for (co = 0; co < OutputChannelCount; co = co + 1) {
        for (ci = 0; ci < InputChannelCount; ci = ci + 1) {
          uVar1 = i * OutputChannelCount + co;
          pOutputBuffer[uVar1] =
               *(float *)((long)pInputBuffer + (ulong)(i * InputChannelCount + ci) * 4) +
               pOutputBuffer[uVar1];
        }
      }
    }
  }
  return;
}

Assistant:

void FAPOBase_ProcessThru(
	FAPOBase *fapo,
	void* pInputBuffer,
	float *pOutputBuffer,
	uint32_t FrameCount,
	uint16_t InputChannelCount,
	uint16_t OutputChannelCount,
	uint8_t MixWithOutput
) {
	uint32_t i, co, ci;
	float *input = (float*) pInputBuffer;

	if (MixWithOutput)
	{
		/* TODO: SSE */
		for (i = 0; i < FrameCount; i += 1)
		for (co = 0; co < OutputChannelCount; co += 1)
		for (ci = 0; ci < InputChannelCount; ci += 1)
		{
			/* Add, don't overwrite! */
			pOutputBuffer[i * OutputChannelCount + co] +=
				input[i * InputChannelCount + ci];
		}
	}
	else
	{
		/* TODO: SSE */
		for (i = 0; i < FrameCount; i += 1)
		for (co = 0; co < OutputChannelCount; co += 1)
		for (ci = 0; ci < InputChannelCount; ci += 1)
		{
			/* Overwrite, don't add! */
			pOutputBuffer[i * OutputChannelCount + co] =
				input[i * InputChannelCount + ci];
		}
	}
}